

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O3

string * __thiscall
flowtest::join_abi_cxx11_
          (string *__return_storage_ptr__,flowtest *this,initializer_list<flowtest::Token> *tokens)

{
  long lVar1;
  long lVar2;
  long lVar3;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  Token t;
  undefined4 local_284;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  long *local_278 [2];
  long local_268 [2];
  undefined4 *local_258;
  code *local_250;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  local_280 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_280;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)(this + 8);
  if (lVar1 != 0) {
    lVar2 = *(long *)this;
    lVar3 = 0;
    do {
      local_284 = *(undefined4 *)(lVar2 + lVar3);
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      local_258 = &local_284;
      local_250 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ::format_custom_arg<flowtest::Token>;
      local_238 = 0;
      local_248 = &PTR_grow_001ade08;
      local_240 = local_228;
      local_230 = 500;
      format_str.size_ = 2;
      format_str.data_ = "{}";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_258;
      args.types_ = 0xd;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str,args);
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,local_240,local_240 + local_238);
      local_248 = &PTR_grow_001ade08;
      if (local_240 != local_228) {
        operator_delete(local_240,local_230);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278[0]);
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      lVar3 = lVar3 + 4;
    } while (lVar1 << 2 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const std::initializer_list<Token>& tokens) {
  std::string s;
  for (Token t: tokens) {
    if (!s.empty())
      s += ", ";
    s += fmt::format("{}", t);
  }
  return s;
}